

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O2

int write_cidx(int offset,opj_cio_t *cio,opj_image_t *image,opj_codestream_info_t cstr_info,
              int j2klen)

{
  OPJ_UINT32 OVar1;
  opj_bool EPHused;
  int iVar2;
  opj_jp2_box_t *box;
  long lVar3;
  long lVar4;
  opj_codestream_info_t *poVar5;
  double *pdVar6;
  int second;
  int unaff_R15D;
  byte bVar7;
  opj_codestream_info_t in_stack_ffffffffffffff48;
  int local_3c;
  
  bVar7 = 0;
  box = (opj_jp2_box_t *)calloc(0x20,0xc);
  second = 0;
  local_3c = -1;
  iVar2 = 0;
  do {
    if (second != 0) {
      if (second == 2) {
        free(box);
        return unaff_R15D;
      }
      cio_seek(cio,local_3c);
    }
    local_3c = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x63696478,4);
    write_cptr(offset,cstr_info.codestream_size,cio);
    write_manf(second,iVar2,box,cio);
    lVar4 = 0xe;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar1 = write_mainmhix(offset,in_stack_ffffffffffffff48,cio);
    box->length = OVar1;
    box->type = 0x6d686978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar1 = write_tpix(offset,in_stack_ffffffffffffff48,j2klen,cio);
    box[1].length = OVar1;
    box[1].type = 0x74706978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar1 = write_thix(offset,in_stack_ffffffffffffff48,cio);
    box[2].length = OVar1;
    box[2].type = 0x74686978;
    EPHused = check_EPHuse(offset,cstr_info.marker,cstr_info.marknum,cio);
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar1 = write_ppix(offset,in_stack_ffffffffffffff48,EPHused,j2klen,cio);
    box[3].length = OVar1;
    box[3].type = 0x70706978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar1 = write_phix(offset,in_stack_ffffffffffffff48,EPHused,j2klen,cio);
    box[4].length = OVar1;
    box[4].type = 0x70686978;
    iVar2 = cio_tell(cio);
    unaff_R15D = iVar2 - local_3c;
    cio_seek(cio,local_3c);
    cio_write(cio,(long)unaff_R15D,4);
    cio_seek(cio,iVar2);
    second = second + 1;
    iVar2 = 5;
  } while( true );
}

Assistant:

int write_cidx( int offset, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t cstr_info, int j2klen)
{
  int len, i, lenp;
  opj_jp2_box_t *box;
  int num_box = 0;
  opj_bool  EPHused;
  (void)image; /* unused ? */

  lenp = -1;
  box = (opj_jp2_box_t *)opj_calloc( 32, sizeof(opj_jp2_box_t));

  for (i=0;i<2;i++){
  
    if(i)
      cio_seek( cio, lenp);

    lenp = cio_tell( cio);

    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_CIDX, 4);  /* CIDX           */
    write_cptr( offset, cstr_info.codestream_size, cio);

    write_manf( i, num_box, box, cio);
    
    num_box = 0;
    box[num_box].length = write_mainmhix( offset, cstr_info, cio);
    box[num_box].type = JPIP_MHIX;
    num_box++;

    box[num_box].length = write_tpix( offset, cstr_info, j2klen, cio);
    box[num_box].type = JPIP_TPIX;
    num_box++;
      
    box[num_box].length = write_thix( offset, cstr_info, cio);
    box[num_box].type = JPIP_THIX;
    num_box++;

    EPHused = check_EPHuse( offset, cstr_info.marker, cstr_info.marknum, cio);
      
    box[num_box].length = write_ppix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PPIX;
    num_box++;
    
    box[num_box].length = write_phix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PHIX;
    num_box++;
      
    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L             */
    cio_seek( cio, lenp+len);
  }

  opj_free( box);
  
  return len;
}